

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O2

Cast * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::doCast<wasm::RefCast>
          (Cast *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,RefCast *curr)

{
  bool bVar1;
  char cVar2;
  Literal *pLVar3;
  HeapType HVar4;
  HeapType HVar5;
  Literal *this_00;
  Flow local_1d8;
  Flow local_190;
  undefined1 local_148 [8];
  Flow ref;
  Literal local_e8;
  Literal local_d0;
  Literal local_b8;
  Literal local_a0;
  Literal local_88;
  Literal local_70;
  Literal local_58;
  undefined1 local_40 [8];
  Literal val;
  Type castType;
  
  visit((Flow *)local_148,this,*(Expression **)(curr + 0x10));
  if (ref.breakTo.super_IString.str._M_len == 0) {
    pLVar3 = Flow::getSingleValue((Flow *)local_148);
    ::wasm::Literal::Literal((Literal *)local_40,pLVar3);
    val.type.id = *(uintptr_t *)(curr + 8);
    bVar1 = Type::isNull((Type *)&val.field_0.func.super_IString.str._M_str);
    if (bVar1) {
      cVar2 = ::wasm::Type::isNullable();
      if (cVar2 == '\0') {
        ::wasm::Literal::Literal(&local_88,(Literal *)local_40);
        this_00 = &local_e8;
        pLVar3 = &local_88;
        ::wasm::Literal::Literal(this_00,pLVar3);
        std::__detail::__variant::
        _Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
        ::_Variant_storage<2ul,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure&>
                  ((_Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                    *)__return_storage_ptr__,this_00);
      }
      else {
        ::wasm::Literal::Literal(&local_a0,(Literal *)local_40);
        this_00 = (Literal *)&ref.breakTo.super_IString.str._M_str;
        pLVar3 = &local_a0;
        ::wasm::Literal::Literal(this_00,pLVar3);
        std::__detail::__variant::
        _Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
        ::_Variant_storage<1ul,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success&>
                  ((_Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                    *)__return_storage_ptr__,this_00);
      }
    }
    else {
      HVar4.id = ::wasm::Type::getHeapType();
      HVar5.id = ::wasm::Type::getHeapType();
      cVar2 = ::wasm::HeapType::isSubType(HVar4,HVar5);
      if (cVar2 == '\0') {
        ::wasm::Literal::Literal(&local_58,(Literal *)local_40);
        this_00 = &local_b8;
        pLVar3 = &local_58;
        ::wasm::Literal::Literal(this_00,pLVar3);
        std::__detail::__variant::
        _Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
        ::_Variant_storage<2ul,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure&>
                  ((_Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                    *)__return_storage_ptr__,this_00);
      }
      else {
        ::wasm::Literal::Literal(&local_70,(Literal *)local_40);
        this_00 = &local_d0;
        pLVar3 = &local_70;
        ::wasm::Literal::Literal(this_00,pLVar3);
        std::__detail::__variant::
        _Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
        ::_Variant_storage<1ul,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success&>
                  ((_Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                    *)__return_storage_ptr__,this_00);
      }
    }
    ::wasm::Literal::~Literal(this_00);
    ::wasm::Literal::~Literal(pLVar3);
    ::wasm::Literal::~Literal((Literal *)local_40);
  }
  else {
    Flow::Flow(&local_190,(Flow *)local_148);
    Flow::Flow(&local_1d8,&local_190);
    std::__detail::__variant::
    _Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
    ::_Variant_storage<0ul,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking&>
              ((_Variant_storage<false,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Breaking,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Success,wasm::ExpressionRunner<wasm::ModuleRunner>::Cast::Failure>
                *)__return_storage_ptr__,&local_1d8);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&local_1d8);
    SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)&local_190);
  }
  SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

Cast doCast(T* curr) {
    Flow ref = self()->visit(curr->ref);
    if (ref.breaking()) {
      return typename Cast::Breaking{ref};
    }
    Literal val = ref.getSingleValue();
    Type castType = curr->getCastType();
    if (val.isNull()) {
      if (castType.isNullable()) {
        return typename Cast::Success{val};
      } else {
        return typename Cast::Failure{val};
      }
    }
    if (HeapType::isSubType(val.type.getHeapType(), castType.getHeapType())) {
      return typename Cast::Success{val};
    } else {
      return typename Cast::Failure{val};
    }
  }